

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

el_action_t ed_insert(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  
  eVar1 = '\x06';
  if (c != 0) {
    wVar5 = (el->el_state).argument;
    if (((el->el_line).limit <= (el->el_line).lastchar + wVar5) &&
       (wVar2 = ch_enlargebufs(el,(long)wVar5), wVar2 == L'\0')) {
      return '\x06';
    }
    wVar2 = (el->el_state).inputmode;
    if (wVar5 == L'\x01') {
      if ((wVar2 == L'\0') || (pwVar3 = (el->el_line).cursor, (el->el_line).lastchar <= pwVar3)) {
        c_insert(el,L'\x01');
        pwVar3 = (el->el_line).cursor;
      }
      (el->el_line).cursor = pwVar3 + 1;
      *pwVar3 = c;
      re_fastaddc(el);
    }
    else {
      if (wVar2 != L'\x02') {
        c_insert(el,(el->el_state).argument);
      }
      if (wVar5 != L'\0') {
        pwVar3 = (el->el_line).lastchar;
        pwVar4 = (el->el_line).cursor;
        do {
          if (pwVar3 <= pwVar4) break;
          (el->el_line).cursor = pwVar4 + 1;
          *pwVar4 = c;
          wVar5 = wVar5 + L'\xffffffff';
          pwVar4 = pwVar4 + 1;
        } while (wVar5 != L'\0');
      }
      re_refresh(el);
    }
    if ((el->el_state).inputmode == L'\x02') {
      eVar1 = vi_command_mode(el,0);
      return eVar1;
    }
    eVar1 = '\0';
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
ed_insert(EditLine *el, wint_t c)
{
	int count = el->el_state.argument;

	if (c == '\0')
		return CC_ERROR;

	if (el->el_line.lastchar + el->el_state.argument >=
	    el->el_line.limit) {
		/* end of buffer space, try to allocate more */
		if (!ch_enlargebufs(el, (size_t) count))
			return CC_ERROR;	/* error allocating more */
	}

	if (count == 1) {
		if (el->el_state.inputmode == MODE_INSERT
		    || el->el_line.cursor >= el->el_line.lastchar)
			c_insert(el, 1);

		*el->el_line.cursor++ = c;
		re_fastaddc(el);		/* fast refresh for one char. */
	} else {
		if (el->el_state.inputmode != MODE_REPLACE_1)
			c_insert(el, el->el_state.argument);

		while (count-- && el->el_line.cursor < el->el_line.lastchar)
			*el->el_line.cursor++ = c;
		re_refresh(el);
	}

	if (el->el_state.inputmode == MODE_REPLACE_1)
		return vi_command_mode(el, 0);

	return CC_NORM;
}